

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FilePathSpecSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::FilePathSpecSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token path;
  FilePathSpecSyntax *pFVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pFVar1 = (FilePathSpecSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  path.info = in_RSI;
  path._0_8_ = in_RSI->location;
  slang::syntax::FilePathSpecSyntax::FilePathSpecSyntax
            ((FilePathSpecSyntax *)in_RSI->rawTextPtr,path);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }